

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int ON_SubDComponentId::CompareTypeAndIdAndDirection
              (ON_SubDComponentId *lhs,ON_SubDComponentId *rhs)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = CompareTypeAndId(lhs,rhs);
  if (uVar2 == 0) {
    bVar1 = lhs->m_type_and_dir & 1;
    bVar3 = rhs->m_type_and_dir & 1;
    uVar2 = 0xffffffff;
    if (bVar3 <= bVar1) {
      uVar2 = (uint)(bVar3 < bVar1);
    }
  }
  return uVar2;
}

Assistant:

int ON_SubDComponentId::CompareTypeAndIdAndDirection(const ON_SubDComponentId& lhs, const ON_SubDComponentId& rhs)
{
  const int rc = CompareTypeAndId(lhs, rhs);
  if (0 != rc)
    return rc;

  // compare dir
  const unsigned char lhs_dir = (lhs.m_type_and_dir & ON_SubDComponentId::bits_dir_mask);
  const unsigned char rhs_dir = (rhs.m_type_and_dir & ON_SubDComponentId::bits_dir_mask);
  if (lhs_dir < rhs_dir)
    return -1;
  if (lhs_dir > rhs_dir)
    return 1;
  return 0;
}